

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetterFromDescriptor<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          DictionaryPropertyDescriptor<int> *descriptor,Var *setterValue,PropertyValueInfo *info)

{
  byte bVar1;
  int iVar2;
  Var pvVar3;
  DescriptorFlags DVar4;
  
  DVar4 = None;
  if ((descriptor->Attributes & 8) == 0) {
    iVar2 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>(descriptor);
    if (iVar2 == -1) {
      iVar2 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
      DVar4 = None;
      if (iVar2 != -1) {
        iVar2 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
        pvVar3 = DynamicObject::GetSlot(instance,iVar2);
        *setterValue = pvVar3;
        DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
        DVar4 = Accessor;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
    }
    else {
      bVar1 = descriptor->Attributes;
      if ((bVar1 & 0x10) == 0) {
        if ((bVar1 & 4) == 0) {
          DVar4 = (uint)(bVar1 >> 7) * 8 + Data;
        }
        else {
          DVar4 = WritableData;
        }
      }
      else {
        DVar4 = (uint)(bVar1 >> 7) * 4 + WritableData;
      }
    }
  }
  return DVar4;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetterFromDescriptor(DynamicObject* instance, DictionaryPropertyDescriptor<T> * descriptor, Var* setterValue, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & PropertyDeleted)
        {
            return None;
        }
        if (descriptor->template GetDataPropertyIndex<allowLetConstGlobal>() != NoSlots)
        {
            // not a setter but shadows
            if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return (descriptor->Attributes & PropertyConst) ? (DescriptorFlags)(Const | Data) : WritableData;
            }
            if (descriptor->Attributes & PropertyWritable)
            {
                return WritableData;
            }
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const | Data);
            }
            return Data;
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            *setterValue = ((DynamicObject*)instance)->GetSlot(descriptor->GetSetterPropertyIndex());
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
            return Accessor;
        }
        return None;
    }